

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coroutine.hpp
# Opt level: O3

void __thiscall henson::Coroutine<henson::Puppet>::~Coroutine(Coroutine<henson::Puppet> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  coro_stack_free(&this->stack_);
  this_00 = (this->log_).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar1 = (this->super_BaseCoroutine).name_._M_dataplus._M_p;
  paVar2 = &(this->super_BaseCoroutine).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Coroutine()
                        {
#ifndef USE_BOOST
                            coro_stack_free(&stack_);
#endif
                        }